

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void change_extension_to_ply(char *new_filename,char *filename)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  char *filename_ptr;
  
  lVar1 = 0;
  cVar5 = *filename;
  while (cVar5 != '\0') {
    new_filename[lVar1] = cVar5;
    lVar2 = lVar1 + 1;
    lVar1 = lVar1 + 1;
    cVar5 = filename[lVar2];
  }
  lVar2 = (long)(int)lVar1;
  lVar1 = lVar2;
  do {
    lVar7 = lVar1;
    if (lVar7 == 1) {
      iVar6 = 1;
      lVar1 = 0;
      goto LAB_001051a9;
    }
    lVar1 = lVar7 + -1;
  } while (new_filename[lVar7 + -1] != '.');
  iVar6 = (int)lVar7;
LAB_001051a9:
  if (new_filename[(int)lVar1] == '.') {
    pcVar3 = new_filename + iVar6;
    pcVar4 = pcVar3 + 3;
    pcVar3[0] = 'p';
    pcVar3[1] = 'l';
    pcVar3[2] = 'y';
  }
  else {
    pcVar4 = new_filename + lVar2 + 4;
    builtin_strncpy(new_filename + lVar2,".ply",4);
  }
  *pcVar4 = '\0';
  return;
}

Assistant:

static void change_extension_to_ply(char* new_filename, const char* filename)
  {
  const char* filename_ptr = filename;
  int filename_length = 0;
  while (*filename_ptr)
    new_filename[filename_length++] = *filename_ptr++;

  int find_last_dot = filename_length - 1;
  while (find_last_dot)
    {
    if (new_filename[find_last_dot] == '.')
      break;
    --find_last_dot;
    }
  if (new_filename[find_last_dot] == '.')
    {
    new_filename[find_last_dot + 1] = 'p';
    new_filename[find_last_dot + 2] = 'l';
    new_filename[find_last_dot + 3] = 'y';
    new_filename[find_last_dot + 4] = 0;
    }
  else
    {
    new_filename[filename_length + 0] = '.';
    new_filename[filename_length + 1] = 'p';
    new_filename[filename_length + 2] = 'l';
    new_filename[filename_length + 3] = 'y';
    new_filename[filename_length + 4] = 0;
    }
  }